

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::ScanInitBlock(DROPlayer *this)

{
  uint uVar1;
  UINT32 UVar2;
  iterator iVar3;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference local_98;
  reference local_88;
  reference local_78;
  bool local_61;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  _Bit_type *local_40;
  uint local_38;
  _Bit_type *local_30;
  uint local_28;
  ushort local_1a;
  ushort local_18;
  byte local_16;
  byte local_15;
  UINT32 UStack_14;
  UINT16 lastReg;
  UINT16 curReg;
  UINT8 selPort;
  UINT8 curCmd;
  UINT32 filePos;
  DROPlayer *this_local;
  
  _curReg = this;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin(&this->_initRegSet);
  local_40 = iVar3.super__Bit_iterator_base._M_p;
  local_38 = iVar3.super__Bit_iterator_base._M_offset;
  local_30 = local_40;
  local_28 = local_38;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(&this->_initRegSet);
  local_60 = iVar3.super__Bit_iterator_base._M_p;
  local_58 = iVar3.super__Bit_iterator_base._M_offset;
  local_61 = false;
  __first.super__Bit_iterator_base._M_offset = local_28;
  __first.super__Bit_iterator_base._M_p = local_30;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar3.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar3.super__Bit_iterator_base._0_12_,8);
  local_50 = local_60;
  local_48 = local_58;
  std::fill<std::_Bit_iterator,bool>(__first,__last,&local_61);
  this->_initOPL3Enable = '\0';
  UStack_14 = (this->_fileHdr).dataOfs;
  if (1 < (this->_fileHdr).verMajor) {
    local_1a = 0;
    while ((((uVar1 = UStack_14, UVar2 = DataLoader_GetSize(this->_dLoad), uVar1 < UVar2 &&
             (local_15 = this->_fileData[UStack_14], local_15 != (this->_fileHdr).cmdDlyShort)) &&
            (local_15 != (this->_fileHdr).cmdDlyLong)) &&
           ((local_15 & 0x7f) < (this->_fileHdr).regCmdCnt))) {
      local_18 = (local_15 & 0x80) << 1 | (ushort)(this->_fileHdr).regCmdMap[(int)(local_15 & 0x7f)]
      ;
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->_initRegSet,(ulong)local_18);
      std::_Bit_reference::operator=(&local_98,true);
      if (local_18 == 0x105) {
        this->_initOPL3Enable = this->_fileData[UStack_14 + 1];
      }
      UStack_14 = UStack_14 + 2;
    }
LAB_0010e565:
    this->_initBlkEndOfs = UStack_14;
    return;
  }
  local_16 = 0;
  local_1a = 0;
  while (uVar1 = UStack_14, UVar2 = DataLoader_GetSize(this->_dLoad), uVar1 < UVar2) {
    local_15 = this->_fileData[UStack_14];
    if ((local_15 == 2) || (local_15 == 3)) {
      local_16 = local_15 & 1;
      UStack_14 = UStack_14 + 1;
    }
    else {
      local_18 = CONCAT11(local_16,local_15);
      if (local_18 < local_1a) break;
      local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->_initRegSet,(ulong)local_18);
      std::_Bit_reference::operator=(&local_78,true);
      if (local_18 == 0x105) {
        this->_initOPL3Enable = this->_fileData[UStack_14 + 1];
      }
      local_1a = local_18;
      UStack_14 = UStack_14 + 2;
    }
  }
LAB_0010e330:
  do {
    uVar1 = UStack_14;
    UVar2 = DataLoader_GetSize(this->_dLoad);
    if (((UVar2 <= uVar1) || (local_15 = this->_fileData[UStack_14], local_15 == 0)) ||
       (local_15 == 1)) goto LAB_0010e565;
    if ((local_15 != 2) && (local_15 != 3)) {
      if ((local_15 == 4) && (this->_fileData[UStack_14 + 1] < 8)) goto LAB_0010e565;
      local_18 = CONCAT11(local_16,local_15);
      local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->_initRegSet,(ulong)local_18);
      std::_Bit_reference::operator=(&local_88,true);
      if (local_18 == 0x105) {
        this->_initOPL3Enable = this->_fileData[UStack_14 + 1];
      }
      UStack_14 = UStack_14 + 2;
      goto LAB_0010e330;
    }
    local_16 = local_15 & 1;
    UStack_14 = UStack_14 + 1;
  } while( true );
}

Assistant:

void DROPlayer::ScanInitBlock(void)
{
	// Scan initialization block of the DRO in order to be able to apply special fixes.
	// Fixes like:
	//	- DualOPL2 vs. OPL3 detection (because DOSBox sets hwType to DualOPL2 more often that it should)
	//	- [DRO v1] detect size of initialization block (for filtering out unescaped writes to register 01/04)
	UINT32 filePos;
	UINT8 curCmd;
	UINT8 selPort;
	UINT16 curReg;
	UINT16 lastReg;
	
	std::fill(_initRegSet.begin(), _initRegSet.end(), false);
	_initOPL3Enable = 0x00;
	
	filePos = _fileHdr.dataOfs;
	if (_fileHdr.verMajor < 2)
	{
		selPort = 0;
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				// make an exception for the chip select commands
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			
			curReg = (selPort << 8) | (curCmd << 0);
			if (curReg < lastReg)
				break;
			
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			lastReg = curReg;
			filePos += 0x02;
		}
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			
			if (curCmd == 0x00 || curCmd == 0x01)
				break;	// delay command - stop scanning
			if (curCmd == 0x02 || curCmd == 0x03)
			{
				selPort = curCmd & 0x01;
				filePos ++;
				continue;
			}
			if (curCmd == 0x04)
			{
				if (_fileData[filePos + 0x01] < 0x08)
					break;	// properly escaped command - stop scanning
			}
			curReg = (selPort << 8) | (curCmd << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	else //if (_fileHdr.verMajor == 2)
	{
		lastReg = 0x000;
		// The file begins with a register dump with increasing register numbers.
		while(filePos < DataLoader_GetSize(_dLoad))
		{
			curCmd = _fileData[filePos];
			if (curCmd == _fileHdr.cmdDlyShort || curCmd == _fileHdr.cmdDlyLong)
				break;
			
			if ((curCmd & 0x7F) >= _fileHdr.regCmdCnt)
				break;
			curReg = ((curCmd & 0x80) << 1) | (_fileHdr.regCmdMap[curCmd & 0x7F] << 0);
			_initRegSet[curReg] = true;
			if (curReg == 0x105)
				_initOPL3Enable = _fileData[filePos + 0x01];
			filePos += 0x02;
		}
	}
	_initBlkEndOfs = filePos;
	
	return;
}